

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<int,_void>::makeEmptyTable(HighsHashTable<int,_void> *this,u64 capacity)

{
  int iVar1;
  unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *this_00;
  unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *in_RSI;
  long in_RDI;
  unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *__p;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffe0;
  
  *(uchar **)(in_RDI + 0x10) =
       (uchar *)((long)&in_RSI[-1]._M_t.
                        super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                        .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl
                + 7);
  iVar1 = HighsHashHelpers::log2i((uint64_t)in_RSI);
  *(long *)(in_RDI + 0x18) = (long)(0x40 - iVar1);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  __p = in_RSI;
  this_00 = (unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *)
            operator_new__((ulong)in_RSI);
  memset(this_00,0,(size_t)__p);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this_00,
             (uchar *)__p);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this_00,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)__p);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_ffffffffffffffe0);
  operator_new((long)in_RSI << 2);
  std::unique_ptr<HighsHashTableEntry<int,void>,HighsHashTable<int,void>::OpNewDeleter>::
  unique_ptr<HighsHashTable<int,void>::OpNewDeleter,void>(this_00,(pointer)__p);
  std::unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>::
  operator=(this_00,__p);
  std::unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>::
  ~unique_ptr(this_00);
  return;
}

Assistant:

void makeEmptyTable(u64 capacity) {
    tableSizeMask = capacity - 1;
    numHashShift = 64 - HighsHashHelpers::log2i(capacity);
    assert(capacity == (u64{1} << (64 - numHashShift)));
    numElements = 0;

    metadata = decltype(metadata)(new u8[capacity]{});
    entries =
        decltype(entries)((Entry*)::operator new(sizeof(Entry) * capacity));
  }